

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O1

string * __thiscall
cmCustomCommandGenerator::GetFullDepfile_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this)

{
  bool bVar1;
  string *psVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string depfile;
  string local_b8;
  string local_98;
  undefined8 local_78;
  undefined1 *local_70;
  undefined1 local_68 [32];
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined8 local_38;
  undefined1 *local_30;
  size_type local_28;
  pointer local_20;
  
  GetDepfile_abi_cxx11_(&local_b8,this);
  if (local_b8._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    bVar1 = cmsys::SystemTools::FileIsFullPath(&local_b8);
    if (!bVar1) {
      psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LG);
      local_48._M_str = (psVar2->_M_dataplus)._M_p;
      local_48._M_len = psVar2->_M_string_length;
      local_70 = local_68;
      local_78 = 1;
      local_68[0] = 0x2f;
      local_38 = 1;
      local_28 = local_b8._M_string_length;
      local_20 = local_b8._M_dataplus._M_p;
      views._M_len = 3;
      views._M_array = &local_48;
      local_30 = local_70;
      cmCatViews_abi_cxx11_(&local_98,views);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,&local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetFullDepfile() const
{
  std::string depfile = this->GetDepfile();
  if (depfile.empty()) {
    return "";
  }

  if (!cmSystemTools::FileIsFullPath(depfile)) {
    depfile = cmStrCat(this->LG->GetCurrentBinaryDirectory(), '/', depfile);
  }
  return cmSystemTools::CollapseFullPath(depfile);
}